

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor.c
# Opt level: O1

int coda_cursor_get_index(coda_cursor *cursor,long *index)

{
  uint uVar1;
  undefined8 uVar2;
  char *message;
  
  if (((cursor == (coda_cursor *)0x0) || (cursor->n < 2)) ||
     (uVar1 = cursor->n - 1, cursor->stack[uVar1].type == (coda_dynamic_type_struct *)0x0)) {
    message = "invalid cursor argument (%s:%u)";
    uVar2 = 0x708;
  }
  else {
    if (index != (long *)0x0) {
      *index = cursor->stack[uVar1].index;
      return 0;
    }
    message = "index argument is NULL (%s:%u)";
    uVar2 = 0x70e;
  }
  coda_set_error(-100,message,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                 ,uVar2);
  return -1;
}

Assistant:

LIBCODA_API int coda_cursor_get_index(const coda_cursor *cursor, long *index)
{
    if (cursor == NULL || cursor->n <= 1 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    if (index == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "index argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    *index = cursor->stack[cursor->n - 1].index;

    return 0;
}